

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cpp
# Opt level: O1

void * __thiscall DeviceTy::getTgtPtrBegin(DeviceTy *this,void *HstPtrBegin,int64_t Size)

{
  void *pvVar1;
  LookupResult LVar2;
  
  LVar2 = lookupMapping(this,HstPtrBegin,Size);
  if (((undefined1  [16])LVar2 & (undefined1  [16])0x7) == (undefined1  [16])0x0) {
    pvVar1 = (void *)0x0;
  }
  else {
    pvVar1 = (void *)(((long)HstPtrBegin + (long)LVar2.Entry._M_node._M_node[2]._M_prev) -
                     (long)LVar2.Entry._M_node._M_node[1]._M_prev);
  }
  return pvVar1;
}

Assistant:

void *DeviceTy::getTgtPtrBegin(void *HstPtrBegin, int64_t Size) {
  uintptr_t hp = (uintptr_t)HstPtrBegin;
  LookupResult lr = lookupMapping(HstPtrBegin, Size);
  if (lr.Flags.IsContained || lr.Flags.ExtendsBefore || lr.Flags.ExtendsAfter) {
    auto &HT = *lr.Entry;
    uintptr_t tp = HT.TgtPtrBegin + (hp - HT.HstPtrBegin);
    return (void *)tp;
  }

  return NULL;
}